

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::IOException::
IOException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (IOException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::__cxx11::string::string((string *)&local_88,(string *)params);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)params_1);
  ::std::__cxx11::string::string((string *)&local_c8,(string *)params_2);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff18,(string *)params_3);
  ::std::__cxx11::string::string((string *)&local_48,(string *)params_4);
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_68,(Exception *)msg,&local_88,&local_a8,&local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff18,&local_48,in_stack_ffffffffffffff10);
  IOException(this,&local_68);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

explicit IOException(const string &msg, ARGS... params) : IOException(ConstructMessage(msg, params...)) {
	}